

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

bool __thiscall
QMarkdownTextEdit::increaseSelectedTextIndention
          (QMarkdownTextEdit *this,bool reverse,QString *indentCharacters)

{
  QRegularExpression *this_00;
  long lVar1;
  QArrayData *pQVar2;
  undefined1 auVar3 [8];
  Data *pDVar4;
  QRegularExpression QVar5;
  char cVar6;
  MoveMode MVar7;
  MoveMode MVar8;
  int iVar9;
  longlong lVar10;
  QString *pQVar11;
  char16_t *pcVar12;
  int iVar13;
  bool bVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QString t_2;
  QTextCursor cursor;
  QString t_1;
  QString t;
  QString newText;
  QString newLine;
  QString selectedText;
  QString local_138;
  undefined1 local_120 [8];
  QString local_118;
  QString local_100;
  QString local_e8;
  QArrayData *local_d0;
  char16_t *local_c8;
  undefined8 local_c0;
  QString local_b8;
  QMarkdownTextEdit *local_a0;
  QString local_98;
  undefined1 local_80 [16];
  char16_t *local_70;
  storage_type_conflict *psStack_68;
  QRegularExpression local_60;
  char16_t *local_58;
  long lStack_50;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  
  local_a0 = this;
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  if (lStack_50 == 0) {
    if (reverse) {
      iVar9 = (int)(indentCharacters->d).size;
      if (0 < iVar9) {
        this_00 = (QRegularExpression *)(local_80 + 8);
        do {
          MVar7 = QTextCursor::position();
          cVar6 = QTextCursor::atStart();
          iVar13 = (int)local_120;
          if (cVar6 == '\0') {
            QTextCursor::setPosition(iVar13,MVar7 - KeepAnchor);
          }
          local_138.d.d = (Data *)0x0;
          local_138.d.ptr = L"[\\t ]";
          local_138.d.size = 5;
          QRegularExpression::QRegularExpression(this_00,&local_138,0);
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          QTextCursor::selectedText();
          QRegularExpression::match((QRegularExpressionMatch *)&local_e8,this_00,&local_138,0,0,0);
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          cVar6 = QRegularExpressionMatch::hasMatch();
          if (cVar6 == '\0') {
            QTextCursor::setPosition(iVar13,MVar7);
            cVar6 = QTextCursor::atEnd();
            if (cVar6 == '\0') {
              QTextCursor::setPosition(iVar13,MVar7 + KeepAnchor);
            }
          }
          QTextCursor::selectedText();
          QRegularExpression::match((QRegularExpressionMatch *)&local_118,this_00,&local_138,0,0,0);
          pDVar4 = local_e8.d.d;
          local_e8.d.d = local_118.d.d;
          local_118.d.d = pDVar4;
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_118);
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
            }
          }
          cVar6 = QRegularExpressionMatch::hasMatch();
          if (cVar6 != '\0') {
            QTextCursor::removeSelectedText();
          }
          QPlainTextEdit::textCursor();
          auVar3 = local_120;
          local_120 = (undefined1  [8])local_138.d.d;
          local_138.d.d = (Data *)auVar3;
          QTextCursor::~QTextCursor((QTextCursor *)&local_138);
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_e8);
          QRegularExpression::~QRegularExpression(this_00);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else {
      QTextCursor::insertText((QString *)local_120);
    }
    goto LAB_001159e5;
  }
  MVar7 = QTextCursor::selectionEnd();
  MVar8 = QTextCursor::selectionStart();
  QTextCursor::setPosition((int)local_120,MVar8);
  QTextCursor::movePosition((MoveOperation)local_120,4,0);
  QTextCursor::setPosition((int)local_120,MVar7);
  QPlainTextEdit::setTextCursor((QTextCursor *)local_a0);
  QTextCursor::selectedText();
  lVar1 = lStack_50;
  pcVar12 = local_58;
  QVar5.d.d = local_60.d.d;
  local_60.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                 (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_138.d.d;
  local_138.d.d = (Data *)QVar5.d.d;
  local_58 = local_138.d.ptr;
  lStack_50 = local_138.d.size;
  local_138.d.ptr = pcVar12;
  local_138.d.size = lVar1;
  if (QVar5.d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)QVar5.d.d = *(int *)QVar5.d.d + -1;
    UNLOCK();
    if (*(int *)QVar5.d.d == 0) {
      QArrayData::deallocate((QArrayData *)QVar5.d.d,2,8);
    }
  }
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = L"e280a9";
  local_e8.d.size = 6;
  QByteArray::fromHex((QByteArray *)&local_138);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)&local_118,(QByteArray *)&local_138);
  QVar15.m_data = (storage_type *)local_118.d.d;
  QVar15.m_size = (qsizetype)(local_80 + 8);
  QString::fromUtf8(QVar15);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,8);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,8);
    }
  }
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
  if (reverse) {
    lVar1 = (indentCharacters->d).size;
    if (lVar1 == 1) {
      QVar16.m_data = (indentCharacters->d).ptr;
      QVar16.m_size = 1;
      QVar18.m_data = L"\t";
      QVar18.m_size = 1;
      iVar9 = QtPrivate::compareStrings(QVar16,QVar18,CaseSensitive);
      bVar14 = iVar9 == 0;
    }
    else {
      bVar14 = false;
    }
    iVar9 = 4;
    if (!bVar14) {
      iVar9 = (int)lVar1;
    }
    local_d0 = (QArrayData *)0x0;
    local_c8 = L"(\\t| {1,";
    local_c0 = 8;
    local_100.d.d = (Data *)local_80._8_8_;
    local_100.d.ptr = local_70;
    local_100.d.size = (qsizetype)psStack_68;
    if ((QArrayData *)local_80._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_80._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_80._8_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_100);
    QString::number((int)&local_b8,iVar9);
    local_118.d.d = local_100.d.d;
    local_118.d.ptr = local_100.d.ptr;
    local_118.d.size = local_100.d.size;
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_118);
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = L"})";
    local_98.d.size = 2;
    local_138.d.d = local_118.d.d;
    local_138.d.ptr = local_118.d.ptr;
    local_138.d.size = local_118.d.size;
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_138);
    QRegularExpression::QRegularExpression((QRegularExpression *)local_80,&local_138,0);
    local_48 = (QArrayData *)0x0;
    local_40 = L"\n";
    local_38 = 1;
    pQVar11 = (QString *)QString::replace(&local_60,(QString *)local_80);
    QString::operator=(&local_e8,pQVar11);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_80);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,8);
      }
    }
    QString::number((int)&local_d0,iVar9);
    local_100.d.d = (Data *)0x0;
    local_100.d.ptr = L"^(\\t| {1,";
    local_100.d.size = 9;
    QString::append(&local_100);
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = L"})";
    local_b8.d.size = 2;
    local_118.d.d = local_100.d.d;
    local_118.d.ptr = local_100.d.ptr;
    local_118.d.size = local_100.d.size;
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_118);
    QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_118,0);
    local_138.d.d = (Data *)0x0;
    local_138.d.ptr = (char16_t *)0x0;
    local_138.d.size = 0;
    QString::replace((QRegularExpression *)&local_e8,&local_98);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar9 = (local_d0->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = local_d0;
joined_r0x00115561:
      if (iVar9 == 0) {
        QArrayData::deallocate(pQVar2,2,8);
      }
    }
  }
  else {
    QVar17.m_data = psStack_68;
    QVar17.m_size = (qsizetype)&local_118;
    QRegularExpression::escape(QVar17);
    local_100.d.d = (Data *)0x0;
    local_100.d.ptr = L"$";
    local_100.d.size = 1;
    local_138.d.d = local_118.d.d;
    local_138.d.ptr = local_118.d.ptr;
    local_138.d.size = local_118.d.size;
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_138);
    QRegularExpression::QRegularExpression((QRegularExpression *)&local_b8,&local_138,0);
    local_d0 = (QArrayData *)0x0;
    local_c8 = L"\n";
    local_c0 = 1;
    pQVar11 = (QString *)QString::replace(&local_60,&local_b8);
    QString::operator=(&local_e8,pQVar11);
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,8);
      }
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_b8);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,8);
      }
    }
    local_138.d.d = (Data *)0x0;
    local_138.d.ptr = L"\n";
    local_138.d.size = 1;
    QString::append(&local_138);
    lVar10 = QString::replace(&local_e8,(QString *)(local_80 + 8),(CaseSensitivity)&local_138);
    pcVar12 = (indentCharacters->d).ptr;
    if (pcVar12 == (char16_t *)0x0) {
      pcVar12 = (char16_t *)&QString::_empty;
    }
    QString::insert(lVar10,(QChar *)0x0,(longlong)pcVar12);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = L"\\t$";
    local_118.d.size = 3;
    QRegularExpression::QRegularExpression((QRegularExpression *)&local_100,&local_118,0);
    local_138.d.d = (Data *)0x0;
    local_138.d.ptr = (char16_t *)0x0;
    local_138.d.size = 0;
    QString::replace((QRegularExpression *)&local_e8,&local_100);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_100);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar9 = ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = &(local_118.d.d)->super_QArrayData;
      goto joined_r0x00115561;
    }
  }
  QTextCursor::insertText((QString *)local_120);
  iVar9 = QTextCursor::position();
  QTextCursor::setPosition((int)local_120,iVar9 - (int)local_e8.d.size);
  QPlainTextEdit::setTextCursor((QTextCursor *)local_a0);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  if ((QArrayData *)local_80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_80._8_8_,2,8);
    }
  }
LAB_001159e5:
  if (local_60.d.d != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    *(int *)local_60.d.d = *(int *)local_60.d.d + -1;
    UNLOCK();
    if (*(int *)local_60.d.d == 0) {
      QArrayData::deallocate((QArrayData *)local_60.d.d,2,8);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_120);
  return true;
}

Assistant:

bool QMarkdownTextEdit::increaseSelectedTextIndention(
    bool reverse, const QString &indentCharacters) {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    if (!selectedText.isEmpty()) {
        // Start the selection at start of the first block of the selection
        int end = cursor.selectionEnd();
        cursor.setPosition(cursor.selectionStart());
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::MoveAnchor);
        cursor.setPosition(end, QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);
        selectedText = cursor.selectedText();

        // we need this strange newline character we are getting in the
        // selected text for newlines
        const QString newLine =
            QString::fromUtf8(QByteArray::fromHex(QByteArrayLiteral("e280a9")));
        QString newText;

        if (reverse) {
            // un-indent text

            //          QSettings settings;
            const int indentSize = indentCharacters == QStringLiteral("\t")
                                       ? 4
                                       : indentCharacters.length();

            // remove leading \t or spaces in following lines
            newText = selectedText.replace(
                QRegularExpression(newLine + QStringLiteral("(\\t| {1,") +
                                   QString::number(indentSize) +
                                   QStringLiteral("})")),
                QStringLiteral("\n"));

            // remove leading \t or spaces in first line
            newText.remove(QRegularExpression(QStringLiteral("^(\\t| {1,") +
                                              QString::number(indentSize) +
                                              QStringLiteral("})")));
        } else {
            // replace trailing new line to prevent an indent of the line after
            // the selection
            newText = selectedText.replace(
                QRegularExpression(QRegularExpression::escape(newLine) +
                                   QStringLiteral("$")),
                QStringLiteral("\n"));

            // indent text
            newText.replace(newLine, QStringLiteral("\n") + indentCharacters)
                .prepend(indentCharacters);

            // remove trailing \t
            newText.remove(QRegularExpression(QStringLiteral("\\t$")));
        }

        // insert the new text
        cursor.insertText(newText);

        // update the selection to the new text
        cursor.setPosition(cursor.position() - newText.size(),
                           QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);

        return true;
    } else if (reverse) {
        const int indentSize = indentCharacters.length();

        // do the check as often as we have characters to un-indent
        for (int i = 1; i <= indentSize; i++) {
            // if nothing was selected but we want to reverse the indention
            // check if there is a \t in front or after the cursor and remove it
            // if so
            const int position = cursor.position();

            if (!cursor.atStart()) {
                // get character in front of cursor
                cursor.setPosition(position - 1, QTextCursor::KeepAnchor);
            }

            // check for \t or space in front of cursor
            QRegularExpression re(QStringLiteral("[\\t ]"));
            QRegularExpressionMatch match = re.match(cursor.selectedText());

            if (!match.hasMatch()) {
                // (select to) check for \t or space after the cursor
                cursor.setPosition(position);

                if (!cursor.atEnd()) {
                    cursor.setPosition(position + 1, QTextCursor::KeepAnchor);
                }
            }

            match = re.match(cursor.selectedText());

            if (match.hasMatch()) {
                cursor.removeSelectedText();
            }

            cursor = this->textCursor();
        }

        return true;
    }

    // else just insert indentCharacters
    cursor.insertText(indentCharacters);

    return true;
}